

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Tree::change_type(Tree *this,size_t node,NodeType type)

{
  NodeData *pNVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  bool bVar7;
  undefined1 uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  byte bVar14;
  char msg [64];
  char local_118 [24];
  char *pcStack_100;
  char local_f8 [48];
  undefined4 local_c8;
  undefined2 local_c4;
  NodeType_e local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar14 = 0;
  uVar13 = (uint)type.type;
  uVar10 = (ulong)(uVar13 & 3);
  if ((type.type & (SEQ|MAP)) == NOTYPE && uVar10 != 1) {
    builtin_strncpy(local_f8 + 0x10," type.is_seq())",0x10);
    builtin_strncpy(local_f8,"type.is_map() ||",0x10);
    builtin_strncpy(local_118 + 0x10,"ype.is_v",8);
    pcStack_100 = (char *)0x207c7c2029286c61;
    builtin_strncpy(local_118,"check failed: (t",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        uVar8 = (*pcVar2)();
        return (bool)uVar8;
      }
    }
    local_58 = 0;
    uStack_50 = 0x658b;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x658b) << 0x40);
    LVar3.name.str._0_4_ = 0x1fbf6a;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_118,0x40,LVar3,(this->m_callbacks).m_user_data);
  }
  if (((uVar13 & 8) >> 3) + ((uVar13 & 4) >> 2) + (uint)((uVar13 & 3) == 1) != 1) {
    pcVar11 = "check failed: (type.is_val() + type.is_map() + type.is_seq() == 1)";
    pcVar12 = local_118;
    for (lVar9 = 8; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(undefined8 *)pcVar12 = *(undefined8 *)pcVar11;
      pcVar11 = pcVar11 + ((ulong)bVar14 * -2 + 1) * 8;
      pcVar12 = pcVar12 + ((ulong)bVar14 * -2 + 1) * 8;
    }
    local_f8[0x22] = 0;
    local_f8[0x20] = '1';
    local_f8[0x21] = ')';
    if ((s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        uVar8 = (*pcVar2)();
        return (bool)uVar8;
      }
    }
    local_80 = 0;
    uStack_78 = 0x658c;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x658c) << 0x40);
    LVar5.name.str._0_4_ = 0x1fbf6a;
    LVar5.super_LineCol.offset = auVar4._0_8_;
    LVar5.super_LineCol.line = auVar4._8_8_;
    LVar5.super_LineCol.col = auVar4._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_118,0x43,LVar5,(this->m_callbacks).m_user_data);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        uVar8 = (*pcVar2)();
        return (bool)uVar8;
      }
    }
    local_118[0] = '\0';
    local_118[1] = '\0';
    local_118[2] = '\0';
    local_118[3] = '\0';
    local_118[4] = '\0';
    local_118[5] = '\0';
    local_118[6] = '\0';
    local_118[7] = '\0';
    local_118[8] = -0x7a;
    local_118[9] = 'K';
    local_118[10] = '\0';
    local_118[0xb] = '\0';
    local_118[0xc] = '\0';
    local_118[0xd] = '\0';
    local_118[0xe] = '\0';
    local_118[0xf] = '\0';
    local_118[0x10] = '\0';
    local_118[0x11] = '\0';
    local_118[0x12] = '\0';
    local_118[0x13] = '\0';
    local_118[0x14] = '\0';
    local_118[0x15] = '\0';
    local_118[0x16] = '\0';
    local_118[0x17] = '\0';
    pcStack_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_f8[0] = 'e';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  local_b0 = uVar10;
  if ((byte)((uVar13 & 2) >> 1) != (byte)((char)this->m_buf[node].m_type.type & KEY) >> 1) {
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          uVar8 = (*pcVar2)();
          return (bool)uVar8;
        }
      }
      local_118[0] = '\0';
      local_118[1] = '\0';
      local_118[2] = '\0';
      local_118[3] = '\0';
      local_118[4] = '\0';
      local_118[5] = '\0';
      local_118[6] = '\0';
      local_118[7] = '\0';
      local_118[8] = -0x7a;
      local_118[9] = 'K';
      local_118[10] = '\0';
      local_118[0xb] = '\0';
      local_118[0xc] = '\0';
      local_118[0xd] = '\0';
      local_118[0xe] = '\0';
      local_118[0xf] = '\0';
      local_118[0x10] = '\0';
      local_118[0x11] = '\0';
      local_118[0x12] = '\0';
      local_118[0x13] = '\0';
      local_118[0x14] = '\0';
      local_118[0x15] = '\0';
      local_118[0x16] = '\0';
      local_118[0x17] = '\0';
      pcStack_100 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f8[0] = 'e';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (((type.type & KEY) != NOTYPE) || ((this->m_buf[node].m_type.type & KEY) == NOTYPE)) {
      pcVar11 = 
      "check failed: (type.has_key() == has_key(node) || (has_key(node) && !type.has_key()))";
      pcVar12 = local_118;
      for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined8 *)pcVar12 = *(undefined8 *)pcVar11;
        pcVar11 = pcVar11 + ((ulong)bVar14 * -2 + 1) * 8;
        pcVar12 = pcVar12 + ((ulong)bVar14 * -2 + 1) * 8;
      }
      local_c4 = 0x29;
      local_c8 = 0x29292879;
      if ((s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          uVar8 = (*pcVar2)();
          return (bool)uVar8;
        }
      }
      local_a8 = 0;
      uStack_a0 = 0x658d;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x658d) << 0x40);
      LVar6.name.str._0_4_ = 0x1fbf6a;
      LVar6.super_LineCol.offset = auVar4._0_8_;
      LVar6.super_LineCol.line = auVar4._8_8_;
      LVar6.super_LineCol.col = auVar4._16_8_;
      LVar6.name.str._4_4_ = 0;
      LVar6.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_118,0x56,LVar6,(this->m_callbacks).m_user_data);
    }
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar2 = (code *)swi(3);
        uVar8 = (*pcVar2)();
        return (bool)uVar8;
      }
    }
    local_118[0] = '\0';
    local_118[1] = '\0';
    local_118[2] = '\0';
    local_118[3] = '\0';
    local_118[4] = '\0';
    local_118[5] = '\0';
    local_118[6] = '\0';
    local_118[7] = '\0';
    local_118[8] = -0x7d;
    local_118[9] = 'K';
    local_118[10] = '\0';
    local_118[0xb] = '\0';
    local_118[0xc] = '\0';
    local_118[0xd] = '\0';
    local_118[0xe] = '\0';
    local_118[0xf] = '\0';
    local_118[0x10] = '\0';
    local_118[0x11] = '\0';
    local_118[0x12] = '\0';
    local_118[0x13] = '\0';
    local_118[0x14] = '\0';
    local_118[0x15] = '\0';
    local_118[0x16] = '\0';
    local_118[0x17] = '\0';
    pcStack_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_f8[0] = 'e';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    (*(code *)PTR_error_impl_0023e4c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar1 = this->m_buf;
  local_b8 = type.type;
  if ((type.type & MAP) == NOTYPE) {
LAB_001c0d01:
    if ((type.type & SEQ) != NOTYPE) {
      if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
        if ((s_error_flags & 1) != 0) {
          bVar7 = is_debugger_attached();
          if (bVar7) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
        }
        local_118[0] = '\0';
        local_118[1] = '\0';
        local_118[2] = '\0';
        local_118[3] = '\0';
        local_118[4] = '\0';
        local_118[5] = '\0';
        local_118[6] = '\0';
        local_118[7] = '\0';
        local_118[8] = -0x7a;
        local_118[9] = 'K';
        local_118[10] = '\0';
        local_118[0xb] = '\0';
        local_118[0xc] = '\0';
        local_118[0xd] = '\0';
        local_118[0xe] = '\0';
        local_118[0xf] = '\0';
        local_118[0x10] = '\0';
        local_118[0x11] = '\0';
        local_118[0x12] = '\0';
        local_118[0x13] = '\0';
        local_118[0x14] = '\0';
        local_118[0x15] = '\0';
        local_118[0x16] = '\0';
        local_118[0x17] = '\0';
        pcStack_100 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_f8[0] = 'e';
        local_f8[1] = '\0';
        local_f8[2] = '\0';
        local_f8[3] = '\0';
        local_f8[4] = '\0';
        local_f8[5] = '\0';
        local_f8[6] = '\0';
        local_f8[7] = '\0';
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[node].m_type.type & SEQ) != NOTYPE) goto LAB_001c0e31;
    }
    if ((int)local_b0 == 1) {
      if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
        if ((s_error_flags & 1) != 0) {
          bVar7 = is_debugger_attached();
          if (bVar7) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
        }
        local_118[0] = '\0';
        local_118[1] = '\0';
        local_118[2] = '\0';
        local_118[3] = '\0';
        local_118[4] = '\0';
        local_118[5] = '\0';
        local_118[6] = '\0';
        local_118[7] = '\0';
        local_118[8] = -0x7a;
        local_118[9] = 'K';
        local_118[10] = '\0';
        local_118[0xb] = '\0';
        local_118[0xc] = '\0';
        local_118[0xd] = '\0';
        local_118[0xe] = '\0';
        local_118[0xf] = '\0';
        local_118[0x10] = '\0';
        local_118[0x11] = '\0';
        local_118[0x12] = '\0';
        local_118[0x13] = '\0';
        local_118[0x14] = '\0';
        local_118[0x15] = '\0';
        local_118[0x16] = '\0';
        local_118[0x17] = '\0';
        pcStack_100 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_f8[0] = 'e';
        local_f8[1] = '\0';
        local_f8[2] = '\0';
        local_f8[3] = '\0';
        local_f8[4] = '\0';
        local_f8[5] = '\0';
        local_f8[6] = '\0';
        local_f8[7] = '\0';
        (*(code *)PTR_error_impl_0023e4c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[node].m_type.type & KEYVAL) == VAL) goto LAB_001c0e31;
    }
    pNVar1[node].m_type.type = pNVar1[node].m_type.type & ~(SEQ|MAP|VAL) | local_b8;
    remove_children(this,node);
    bVar7 = true;
  }
  else {
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          uVar8 = (*pcVar2)();
          return (bool)uVar8;
        }
      }
      local_118[0] = '\0';
      local_118[1] = '\0';
      local_118[2] = '\0';
      local_118[3] = '\0';
      local_118[4] = '\0';
      local_118[5] = '\0';
      local_118[6] = '\0';
      local_118[7] = '\0';
      local_118[8] = -0x7a;
      local_118[9] = 'K';
      local_118[10] = '\0';
      local_118[0xb] = '\0';
      local_118[0xc] = '\0';
      local_118[0xd] = '\0';
      local_118[0xe] = '\0';
      local_118[0xf] = '\0';
      local_118[0x10] = '\0';
      local_118[0x11] = '\0';
      local_118[0x12] = '\0';
      local_118[0x13] = '\0';
      local_118[0x14] = '\0';
      local_118[0x15] = '\0';
      local_118[0x16] = '\0';
      local_118[0x17] = '\0';
      pcStack_100 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f8[0] = 'e';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[node].m_type.type & MAP) == NOTYPE) goto LAB_001c0d01;
LAB_001c0e31:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Tree::change_type(size_t node, NodeType type)
{
    _RYML_CB_ASSERT(m_callbacks, type.is_val() || type.is_map() || type.is_seq());
    _RYML_CB_ASSERT(m_callbacks, type.is_val() + type.is_map() + type.is_seq() == 1);
    _RYML_CB_ASSERT(m_callbacks, type.has_key() == has_key(node) || (has_key(node) && !type.has_key()));
    NodeData *d = _p(node);
    if(type.is_map() && is_map(node))
        return false;
    else if(type.is_seq() && is_seq(node))
        return false;
    else if(type.is_val() && is_val(node))
        return false;
    d->m_type = (d->m_type & (~(MAP|SEQ|VAL))) | type;
    remove_children(node);
    return true;
}